

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O1

void duckdb::
     HistogramFinalizeFunction<duckdb::HistogramFunctor,unsigned_char,duckdb::DefaultMapType<std::map<unsigned_char,unsigned_long,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,unsigned_long>>>>>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  ulong uVar1;
  ulong *puVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  idx_t size;
  Vector *pVVar8;
  Vector *pVVar9;
  ulong uVar10;
  _Rb_tree_node_base *p_Var11;
  TemplatedValidityData<unsigned_long> *pTVar12;
  idx_t iVar13;
  idx_t iVar14;
  long *plVar15;
  long lVar16;
  ulong uVar17;
  UnifiedVectorFormat sdata;
  element_type *local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_b0;
  buffer_ptr<ValidityBuffer> *local_a0;
  ulong local_98;
  data_ptr_t local_90;
  idx_t local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  local_88 = offset;
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(state_vector,count,&local_78);
  FlatVector::VerifyFlatVector(result);
  size = ListVector::GetListSize(result);
  if (count == 0) {
    lVar16 = 0;
  }
  else {
    lVar16 = 0;
    iVar13 = 0;
    do {
      iVar14 = iVar13;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        iVar14 = (idx_t)(local_78.sel)->sel_vector[iVar13];
      }
      if (**(long **)(local_78.data + iVar14 * 8) != 0) {
        lVar16 = lVar16 + *(long *)(**(long **)(local_78.data + iVar14 * 8) + 0x28);
      }
      iVar13 = iVar13 + 1;
    } while (count != iVar13);
  }
  ListVector::Reserve(result,lVar16 + size);
  pVVar8 = MapVector::GetKeys(result);
  pVVar9 = MapVector::GetValues(result);
  if (count != 0) {
    local_90 = local_78.data;
    pdVar3 = result->data;
    pdVar4 = pVVar9->data;
    local_a0 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
    uVar17 = 0;
    local_98 = count;
    do {
      uVar10 = uVar17;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        uVar10 = (ulong)(local_78.sel)->sel_vector[uVar17];
      }
      uVar1 = uVar17 + local_88;
      lVar16 = **(long **)(local_90 + uVar10 * 8);
      if (lVar16 == 0) {
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_b8,&local_80);
          p_Var7 = p_Stack_b0;
          peVar6 = local_b8;
          local_b8 = (element_type *)0x0;
          p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar6;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var7;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if (p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
          }
          pTVar12 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (local_a0);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)
               (pTVar12->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar5 = (byte)uVar1 & 0x3f;
        puVar2 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                 (uVar1 >> 6);
        *puVar2 = *puVar2 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
      }
      else {
        *(idx_t *)(pdVar3 + uVar1 * 0x10) = size;
        for (p_Var11 = *(_Rb_tree_node_base **)(lVar16 + 0x18);
            p_Var11 != (_Rb_tree_node_base *)(lVar16 + 8);
            p_Var11 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var11)) {
          pVVar8->data[size] = (char)p_Var11[1]._M_color;
          *(_Base_ptr *)(pdVar4 + size * 8) = p_Var11[1]._M_parent;
          size = size + 1;
        }
        plVar15 = (long *)(pdVar3 + uVar1 * 0x10);
        plVar15[1] = size - *plVar15;
      }
      uVar17 = uVar17 + 1;
      count = local_98;
    } while (uVar17 != local_98);
  }
  ListVector::SetListSize(result,size);
  Vector::Verify(result,count);
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void HistogramFinalizeFunction(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count,
                                      idx_t offset) {
	using HIST_STATE = HistogramAggState<T, typename MAP_TYPE::MAP_TYPE>;

	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);
	auto states = UnifiedVectorFormat::GetData<HIST_STATE *>(sdata);

	auto &mask = FlatVector::Validity(result);
	auto old_len = ListVector::GetListSize(result);
	idx_t new_entries = 0;
	// figure out how much space we need
	for (idx_t i = 0; i < count; i++) {
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.hist) {
			continue;
		}
		new_entries += state.hist->size();
	}
	// reserve space in the list vector
	ListVector::Reserve(result, old_len + new_entries);
	auto &keys = MapVector::GetKeys(result);
	auto &values = MapVector::GetValues(result);
	auto list_entries = FlatVector::GetData<list_entry_t>(result);
	auto count_entries = FlatVector::GetData<uint64_t>(values);

	idx_t current_offset = old_len;
	for (idx_t i = 0; i < count; i++) {
		const auto rid = i + offset;
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.hist) {
			mask.SetInvalid(rid);
			continue;
		}

		auto &list_entry = list_entries[rid];
		list_entry.offset = current_offset;
		for (auto &entry : *state.hist) {
			OP::template HistogramFinalize<T>(entry.first, keys, current_offset);
			count_entries[current_offset] = entry.second;
			current_offset++;
		}
		list_entry.length = current_offset - list_entry.offset;
	}
	D_ASSERT(current_offset == old_len + new_entries);
	ListVector::SetListSize(result, current_offset);
	result.Verify(count);
}